

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MapDrive.cpp
# Opt level: O0

void __thiscall
anon_unknown.dwarf_45a12::MapDrivePlugIn::redraw
          (MapDrivePlugIn *this,float currentTime,float elapsedTime)

{
  Vec3 location;
  ostream *poVar1;
  long in_RDI;
  float fVar2;
  float fVar3;
  float fVar4;
  float fVar5;
  float fVar6;
  float w_00;
  float p;
  float c;
  float l;
  float s_1;
  float f;
  float w;
  float m;
  float v;
  Color color;
  Vec3 screenLocation;
  float h;
  ostringstream status;
  float MPSperMPH;
  float secondsPerHour;
  float metersPerMile;
  float tick;
  float u;
  float s;
  float in_stack_fffffffffffffb48;
  float in_stack_fffffffffffffb4c;
  float in_stack_fffffffffffffb50;
  float in_stack_fffffffffffffb54;
  undefined4 in_stack_fffffffffffffb58;
  undefined4 in_stack_fffffffffffffb5c;
  undefined4 in_stack_fffffffffffffb60;
  float in_stack_fffffffffffffb64;
  ostream *in_stack_fffffffffffffba0;
  Color *in_stack_fffffffffffffba8;
  undefined4 in_stack_fffffffffffffbb0;
  int in_stack_fffffffffffffbb4;
  ostream *in_stack_fffffffffffffbc8;
  undefined4 in_stack_fffffffffffffc80;
  undefined4 in_stack_fffffffffffffc84;
  MapDriver *in_stack_fffffffffffffcf0;
  Vec3 local_304;
  Vec3 local_2f8;
  Vec3 local_2ec;
  Vec3 local_2e0;
  Vec3 local_2d4;
  Vec3 local_2c8;
  Vec3 local_2bc;
  Vec3 local_2b0;
  Vec3 local_2a4;
  float local_298;
  float local_294;
  Vec3 local_290;
  Vec3 local_284;
  float local_278;
  float local_274;
  float local_270;
  float local_26c;
  undefined4 local_268;
  undefined4 local_264;
  float local_258;
  MapDriver *in_stack_fffffffffffffdb0;
  Color local_244;
  Vec3 local_234;
  float local_228;
  fmtflags local_224;
  int local_220;
  ostringstream local_210 [376];
  undefined4 local_98;
  undefined4 local_94;
  undefined4 local_90;
  Vec3 local_8c;
  Vec3 local_80;
  Vec3 local_74;
  Vec3 local_68;
  undefined4 local_5c;
  Color local_58;
  Vec3 local_48;
  Vec3 local_3c;
  Vec3 local_30;
  Vec3 local_24;
  undefined4 local_18;
  float local_14;
  
  OpenSteer::OpenSteerDemo::updateCamera
            (in_stack_fffffffffffffb54,in_stack_fffffffffffffb50,
             (AbstractVehicle *)CONCAT44(in_stack_fffffffffffffb4c,in_stack_fffffffffffffb48));
  local_14 = (anonymous_namespace)::MapDriver::worldSize * 2.0;
  local_18 = 0xbe4ccccd;
  OpenSteer::Vec3::Vec3(&local_24,local_14,-0.2,local_14);
  OpenSteer::Vec3::Vec3(&local_30,local_14,-0.2,-local_14);
  OpenSteer::Vec3::Vec3(&local_3c,-local_14,-0.2,-local_14);
  OpenSteer::Vec3::Vec3(&local_48,-local_14,-0.2,local_14);
  OpenSteer::Color::Color(&local_58,0.8,0.7,0.5,1.0);
  OpenSteer::drawQuadrangle
            ((Vec3 *)CONCAT44(in_stack_fffffffffffffb64,in_stack_fffffffffffffb60),
             (Vec3 *)CONCAT44(in_stack_fffffffffffffb5c,in_stack_fffffffffffffb58),
             (Vec3 *)CONCAT44(in_stack_fffffffffffffb54,in_stack_fffffffffffffb50),
             (Vec3 *)CONCAT44(in_stack_fffffffffffffb4c,in_stack_fffffffffffffb48),(Color *)0x135b30
            );
  MapDriver::drawMap(in_stack_fffffffffffffcf0);
  if ((anonymous_namespace)::MapDriver::demoSelect == 2) {
    MapDriver::drawPath((MapDriver *)CONCAT44(in_stack_fffffffffffffc84,in_stack_fffffffffffffc80));
  }
  MapDriver::draw(in_stack_fffffffffffffdb0);
  local_5c = 0x40000000;
  OpenSteer::Vec3::Vec3(&local_68,2.0,0.0,0.0);
  OpenSteer::Vec3::Vec3(&local_74,-2.0,0.0,0.0);
  OpenSteer::drawLine((Vec3 *)CONCAT44(in_stack_fffffffffffffb54,in_stack_fffffffffffffb50),
                      (Vec3 *)CONCAT44(in_stack_fffffffffffffb4c,in_stack_fffffffffffffb48),
                      (Color *)0x135c02);
  OpenSteer::Vec3::Vec3(&local_80,0.0,0.0,2.0);
  OpenSteer::Vec3::Vec3(&local_8c,0.0,0.0,-2.0);
  OpenSteer::drawLine((Vec3 *)CONCAT44(in_stack_fffffffffffffb54,in_stack_fffffffffffffb50),
                      (Vec3 *)CONCAT44(in_stack_fffffffffffffb4c,in_stack_fffffffffffffb48),
                      (Color *)0x135c73);
  local_90 = 0x44c92b02;
  local_94 = 0x45610000;
  local_98 = 0x3ee4e26d;
  std::__cxx11::ostringstream::ostringstream(local_210);
  poVar1 = std::operator<<((ostream *)local_210,"Speed: ");
  fVar2 = (float)(**(code **)(**(long **)(in_RDI + 8) + 0xd8))();
  poVar1 = (ostream *)std::ostream::operator<<(poVar1,(int)fVar2);
  poVar1 = std::operator<<(poVar1," mps (");
  fVar2 = (float)(**(code **)(**(long **)(in_RDI + 8) + 0xd8))();
  poVar1 = (ostream *)std::ostream::operator<<(poVar1,(int)(fVar2 / 0.44704));
  poVar1 = std::operator<<(poVar1," mph)");
  poVar1 = std::operator<<(poVar1,", average: ");
  local_220 = (int)std::setprecision(1);
  poVar1 = std::operator<<(poVar1,(_Setprecision)local_220);
  local_224 = (fmtflags)std::setiosflags(_S_fixed);
  poVar1 = std::operator<<(poVar1,(_Setiosflags)local_224);
  poVar1 = (ostream *)
           std::ostream::operator<<
                     (poVar1,*(float *)(*(long *)(in_RDI + 8) + 0x118) /
                             *(float *)(*(long *)(in_RDI + 8) + 0x11c));
  std::operator<<(poVar1," mps\n\n");
  poVar1 = std::operator<<((ostream *)local_210,"collisions avoided for ");
  fVar2 = OpenSteer::Clock::getTotalSimulationTime(&OpenSteer::OpenSteerDemo::clock);
  poVar1 = (ostream *)
           std::ostream::operator<<(poVar1,(int)(fVar2 - *(float *)(*(long *)(in_RDI + 8) + 0x10c)))
  ;
  std::operator<<(poVar1," seconds");
  if (0 < *(int *)(*(long *)(in_RDI + 8) + 0x114)) {
    poVar1 = std::operator<<((ostream *)local_210,"\nmean time between collisions: ");
    poVar1 = (ostream *)
             std::ostream::operator<<
                       (poVar1,(int)(*(float *)(*(long *)(in_RDI + 8) + 0x110) /
                                    (float)*(int *)(*(long *)(in_RDI + 8) + 0x114)));
    poVar1 = std::operator<<(poVar1," (");
    poVar1 = (ostream *)
             std::ostream::operator<<(poVar1,(int)*(float *)(*(long *)(in_RDI + 8) + 0x110));
    poVar1 = std::operator<<(poVar1,"/");
    poVar1 = (ostream *)std::ostream::operator<<(poVar1,*(int *)(*(long *)(in_RDI + 8) + 0x114));
    std::operator<<(poVar1,")");
  }
  poVar1 = std::operator<<((ostream *)local_210,"\n\nStuck count: ");
  poVar1 = (ostream *)std::ostream::operator<<(poVar1,*(int *)(*(long *)(in_RDI + 8) + 0x13c));
  poVar1 = std::operator<<(poVar1," (");
  poVar1 = (ostream *)std::ostream::operator<<(poVar1,*(int *)(*(long *)(in_RDI + 8) + 0x140));
  poVar1 = std::operator<<(poVar1," cycles, ");
  poVar1 = (ostream *)std::ostream::operator<<(poVar1,*(int *)(*(long *)(in_RDI + 8) + 0x144));
  fVar2 = SUB84(poVar1,0);
  std::operator<<(poVar1," off path)");
  std::operator<<((ostream *)local_210,"\n\n[F1] ");
  if ((anonymous_namespace)::MapDriver::demoSelect == 1) {
    std::operator<<((ostream *)local_210,"wander, ");
  }
  if ((anonymous_namespace)::MapDriver::demoSelect == 2) {
    std::operator<<((ostream *)local_210,"follow path, ");
  }
  std::operator<<((ostream *)local_210,"avoid obstacle");
  if ((anonymous_namespace)::MapDriver::demoSelect == 2) {
    std::operator<<((ostream *)local_210,"\n[F2] path following direction: ");
    if (*(int *)(*(long *)(in_RDI + 8) + 0xf8) < 1) {
      std::operator<<((ostream *)local_210,"-1");
    }
    else {
      std::operator<<((ostream *)local_210,"+1");
    }
    std::operator<<((ostream *)local_210,"\n[F3] path fence: ");
    if ((*(byte *)(in_RDI + 0x30) & 1) == 0) {
      std::operator<<((ostream *)local_210,"off");
    }
    else {
      std::operator<<((ostream *)local_210,"on");
    }
  }
  std::operator<<((ostream *)local_210,"\n[F4] rocks: ");
  if ((*(byte *)(in_RDI + 0x31) & 1) == 0) {
    std::operator<<((ostream *)local_210,"off");
  }
  else {
    std::operator<<((ostream *)local_210,"on");
  }
  std::operator<<((ostream *)local_210,"\n[F5] prediction: ");
  if ((*(byte *)(*(long *)(in_RDI + 8) + 0x174) & 1) == 0) {
    std::operator<<((ostream *)local_210,"linear");
  }
  else {
    std::operator<<((ostream *)local_210,"curved");
  }
  if ((anonymous_namespace)::MapDriver::demoSelect == 2) {
    in_stack_fffffffffffffbc8 = std::operator<<((ostream *)local_210,"\n\nLap ");
    poVar1 = (ostream *)
             std::ostream::operator<<
                       (in_stack_fffffffffffffbc8,*(int *)(*(long *)(in_RDI + 8) + 0x154));
    poVar1 = std::operator<<(poVar1," (completed: ");
    if (*(int *)(*(long *)(in_RDI + 8) + 0x154) < 2) {
      in_stack_fffffffffffffbb4 = 0;
    }
    else {
      in_stack_fffffffffffffbb4 =
           (int)(((float)*(int *)(*(long *)(in_RDI + 8) + 0x158) /
                 (float)(*(int *)(*(long *)(in_RDI + 8) + 0x154) + -1)) * 100.0);
    }
    in_stack_fffffffffffffba8 = (Color *)std::ostream::operator<<(poVar1,in_stack_fffffffffffffbb4);
    std::operator<<((ostream *)in_stack_fffffffffffffba8,"%)");
    in_stack_fffffffffffffba0 = std::operator<<((ostream *)local_210,"\nHints given: ");
    poVar1 = (ostream *)
             std::ostream::operator<<
                       (in_stack_fffffffffffffba0,*(int *)(*(long *)(in_RDI + 8) + 0x160));
    poVar1 = std::operator<<(poVar1,", taken: ");
    std::ostream::operator<<(poVar1,*(int *)(*(long *)(in_RDI + 8) + 0x164));
  }
  std::operator<<((ostream *)local_210,"\n");
  qqqRange((MapDrivePlugIn *)CONCAT44(in_stack_fffffffffffffb64,in_stack_fffffffffffffb60),
           (char *)CONCAT44(in_stack_fffffffffffffb5c,in_stack_fffffffffffffb58),
           in_stack_fffffffffffffb54,
           (ostringstream *)CONCAT44(in_stack_fffffffffffffb4c,in_stack_fffffffffffffb48));
  qqqRange((MapDrivePlugIn *)CONCAT44(in_stack_fffffffffffffb64,in_stack_fffffffffffffb60),
           (char *)CONCAT44(in_stack_fffffffffffffb5c,in_stack_fffffffffffffb58),
           in_stack_fffffffffffffb54,
           (ostringstream *)CONCAT44(in_stack_fffffffffffffb4c,in_stack_fffffffffffffb48));
  qqqRange((MapDrivePlugIn *)CONCAT44(in_stack_fffffffffffffb64,in_stack_fffffffffffffb60),
           (char *)CONCAT44(in_stack_fffffffffffffb5c,in_stack_fffffffffffffb58),
           in_stack_fffffffffffffb54,
           (ostringstream *)CONCAT44(in_stack_fffffffffffffb4c,in_stack_fffffffffffffb48));
  qqqRange((MapDrivePlugIn *)CONCAT44(in_stack_fffffffffffffb64,in_stack_fffffffffffffb60),
           (char *)CONCAT44(in_stack_fffffffffffffb5c,in_stack_fffffffffffffb58),
           in_stack_fffffffffffffb54,
           (ostringstream *)CONCAT44(in_stack_fffffffffffffb4c,in_stack_fffffffffffffb48));
  std::ostream::operator<<(local_210,std::ends<char,std::char_traits<char>>);
  local_228 = OpenSteer::drawGetWindowHeight();
  OpenSteer::Vec3::Vec3(&local_234,10.0,local_228 + -50.0,0.0);
  OpenSteer::Color::Color(&local_244,0.15,0.15,0.5,1.0);
  OpenSteer::drawGetWindowWidth();
  OpenSteer::drawGetWindowHeight();
  local_258 = local_234.z;
  location.z = fVar2;
  location._0_8_ = in_stack_fffffffffffffbc8;
  OpenSteer::draw2dTextAt2dLocation
            ((ostringstream *)CONCAT44(in_stack_fffffffffffffbb4,in_stack_fffffffffffffbb0),location
             ,in_stack_fffffffffffffba8,(float)((ulong)in_stack_fffffffffffffba0 >> 0x20),
             SUB84(in_stack_fffffffffffffba0,0));
  local_264 = 0x40a00000;
  local_268 = 0x41200000;
  local_26c = OpenSteer::drawGetWindowWidth();
  local_270 = local_26c + -20.0;
  local_274 = OpenSteer::SimpleVehicle::relativeSpeed
                        ((SimpleVehicle *)
                         CONCAT44(in_stack_fffffffffffffb54,in_stack_fffffffffffffb50));
  local_278 = *(float *)(*(long *)(in_RDI + 8) + 0x178);
  OpenSteer::Vec3::Vec3(&local_284,local_270 * local_278 + 10.0,2.0,0.0);
  OpenSteer::Vec3::Vec3(&local_290,local_270 * local_278 + 10.0,8.0,0.0);
  OpenSteer::drawGetWindowWidth();
  OpenSteer::drawGetWindowHeight();
  OpenSteer::draw2dLine
            ((Vec3 *)CONCAT44(in_stack_fffffffffffffb64,in_stack_fffffffffffffb60),
             (Vec3 *)CONCAT44(in_stack_fffffffffffffb5c,in_stack_fffffffffffffb58),
             (Color *)CONCAT44(in_stack_fffffffffffffb54,in_stack_fffffffffffffb50),
             in_stack_fffffffffffffb4c,in_stack_fffffffffffffb48);
  if ((local_278 != 0.0) || (NAN(local_278))) {
    local_294 = *(float *)(*(long *)(in_RDI + 8) + 0x17c);
    local_298 = *(float *)(*(long *)(in_RDI + 8) + 0x180);
    OpenSteer::Vec3::Vec3(&local_2a4,local_270 * local_294 + 10.0,6.0,0.0);
    OpenSteer::Vec3::Vec3(&local_2b0,local_26c + -10.0,6.0,0.0);
    OpenSteer::drawGetWindowWidth();
    OpenSteer::drawGetWindowHeight();
    OpenSteer::draw2dLine
              ((Vec3 *)CONCAT44(in_stack_fffffffffffffb64,in_stack_fffffffffffffb60),
               (Vec3 *)CONCAT44(in_stack_fffffffffffffb5c,in_stack_fffffffffffffb58),
               (Color *)CONCAT44(in_stack_fffffffffffffb54,in_stack_fffffffffffffb50),
               in_stack_fffffffffffffb4c,in_stack_fffffffffffffb48);
    OpenSteer::Vec3::Vec3(&local_2bc,local_270 * local_298 + 10.0,3.0,0.0);
    OpenSteer::Vec3::Vec3(&local_2c8,local_26c + -10.0,4.0,0.0);
    OpenSteer::drawGetWindowWidth();
    in_stack_fffffffffffffb64 = OpenSteer::drawGetWindowHeight();
    OpenSteer::draw2dLine
              ((Vec3 *)CONCAT44(in_stack_fffffffffffffb64,in_stack_fffffffffffffb60),
               (Vec3 *)CONCAT44(in_stack_fffffffffffffb5c,in_stack_fffffffffffffb58),
               (Color *)CONCAT44(in_stack_fffffffffffffb54,in_stack_fffffffffffffb50),
               in_stack_fffffffffffffb4c,in_stack_fffffffffffffb48);
  }
  OpenSteer::Vec3::Vec3(&local_2d4,10.0,5.0,0.0);
  OpenSteer::Vec3::Vec3(&local_2e0,local_270 * local_274 + 10.0,5.0,0.0);
  fVar2 = OpenSteer::drawGetWindowWidth();
  fVar3 = OpenSteer::drawGetWindowHeight();
  OpenSteer::draw2dLine
            ((Vec3 *)CONCAT44(in_stack_fffffffffffffb64,fVar2),
             (Vec3 *)CONCAT44(fVar3,in_stack_fffffffffffffb58),
             (Color *)CONCAT44(in_stack_fffffffffffffb54,in_stack_fffffffffffffb50),
             in_stack_fffffffffffffb4c,in_stack_fffffffffffffb48);
  OpenSteer::Vec3::Vec3(&local_2ec,10.0,5.0,0.0);
  OpenSteer::Vec3::Vec3(&local_2f8,10.0,3.0,0.0);
  fVar4 = OpenSteer::drawGetWindowWidth();
  fVar5 = OpenSteer::drawGetWindowHeight();
  OpenSteer::draw2dLine
            ((Vec3 *)CONCAT44(in_stack_fffffffffffffb64,fVar2),(Vec3 *)CONCAT44(fVar3,fVar4),
             (Color *)CONCAT44(fVar5,in_stack_fffffffffffffb50),in_stack_fffffffffffffb4c,
             in_stack_fffffffffffffb48);
  OpenSteer::Vec3::Vec3(&local_304,local_26c + -10.0,5.0,0.0);
  OpenSteer::Vec3::Vec3((Vec3 *)&stack0xfffffffffffffcf0,local_26c + -10.0,3.0,0.0);
  fVar6 = OpenSteer::drawGetWindowWidth();
  w_00 = OpenSteer::drawGetWindowHeight();
  OpenSteer::draw2dLine
            ((Vec3 *)CONCAT44(in_stack_fffffffffffffb64,fVar2),(Vec3 *)CONCAT44(fVar3,fVar4),
             (Color *)CONCAT44(fVar5,fVar6),w_00,in_stack_fffffffffffffb48);
  std::__cxx11::ostringstream::~ostringstream(local_210);
  return;
}

Assistant:

void redraw (const float currentTime, const float elapsedTime)
        {
            // update camera, tracking test vehicle
            OpenSteerDemo::updateCamera (currentTime, elapsedTime, vehicle);

            // draw "ground plane"  (make it 4x map size)
            const float s = MapDriver::worldSize * 2;
            const float u = -0.2f;
            drawQuadrangle (Vec3 (+s, u, +s),
                            Vec3 (+s, u, -s),
                            Vec3 (-s, u, -s),
                            Vec3 (-s, u, +s),
                            Color (0.8f, 0.7f, 0.5f)); // "sand"

            // draw map and path
            vehicle->drawMap ();
            if (vehicle->demoSelect == 2) vehicle->drawPath ();

            // draw test vehicle
            vehicle->draw ();

            // QQQ mark origin to help spot artifacts
            const float tick = 2;
            drawLine (Vec3 (tick, 0, 0), Vec3 (-tick, 0, 0), gGreen);
            drawLine (Vec3 (0, 0, tick), Vec3 (0, 0, -tick), gGreen);

            // compute conversion factor miles-per-hour to meters-per-second
            const float metersPerMile = 1609.344f;
            const float secondsPerHour = 3600;
            const float MPSperMPH = metersPerMile / secondsPerHour;

            // display status in the upper left corner of the window
            std::ostringstream status;
            status << "Speed: "
                   << (int) vehicle->speed () << " mps ("
                   << (int) (vehicle->speed () / MPSperMPH) << " mph)"
                   << ", average: "
                   << std::setprecision (1) << std::setiosflags (std::ios::fixed)
                   << vehicle->totalDistance / vehicle->totalTime

                   << " mps\n\n";
            status << "collisions avoided for "
                   << (int)(OpenSteerDemo::clock.getTotalSimulationTime () -
                            vehicle->timeOfLastCollision)
                   << " seconds";
            if (vehicle->countOfCollisionFreeTimes > 0)
            {
                status << "\nmean time between collisions: "
                       << (int) (vehicle->sumOfCollisionFreeTimes /
                                 vehicle->countOfCollisionFreeTimes)
                       << " ("
                       << (int)vehicle->sumOfCollisionFreeTimes
                       << "/"
                       << (int)vehicle->countOfCollisionFreeTimes
                       << ")";
            }

            status << "\n\nStuck count: " << vehicle->stuckCount << " (" 
                   << vehicle->stuckCycleCount << " cycles, "
                   << vehicle->stuckOffPathCount << " off path)";
            status << "\n\n[F1] ";
            if (1 == vehicle->demoSelect) status << "wander, ";
            if (2 == vehicle->demoSelect) status << "follow path, ";
            status << "avoid obstacle";

            if (2 == vehicle->demoSelect)
            {
                status << "\n[F2] path following direction: ";
                if (vehicle->pathFollowDirection>0)status<<"+1";else status<<"-1";
                status << "\n[F3] path fence: ";
                if (usePathFences) status << "on"; else status << "off";
            }

            status << "\n[F4] rocks: ";
            if (useRandomRocks) status << "on"; else status << "off";
            status << "\n[F5] prediction: ";
            if (vehicle->curvedSteering)
                status << "curved"; else status << "linear";
            if (2 == vehicle->demoSelect)
            {
                status << "\n\nLap " << vehicle->lapsStarted
                       << " (completed: "
                       << ((vehicle->lapsStarted < 2) ? 0 :
                           (int) (100 * ((float) vehicle->lapsFinished /
                                         (float) (vehicle->lapsStarted - 1))))
                       << "%)";

                status << "\nHints given: " << vehicle->hintGivenCount
                       << ", taken: " << vehicle->hintTakenCount;
            }
            status << "\n";
            qqqRange ("WR ", vehicle->savedNearestWR, status);
            qqqRange ("R  ", vehicle->savedNearestR,  status);
            qqqRange ("L  ", vehicle->savedNearestL,  status);
            qqqRange ("WL ", vehicle->savedNearestWL, status);
            status << std::ends;
            const float h = drawGetWindowHeight ();
            const Vec3 screenLocation (10, h-50, 0);
            const Color color (0.15f, 0.15f, 0.5f);
            draw2dTextAt2dLocation (status, screenLocation, color, drawGetWindowWidth(), drawGetWindowHeight());

            {
                const float v = 5;
                const float m = 10;
                const float w = drawGetWindowWidth ();
                const float f = w - (2 * m);
                const float s = vehicle->relativeSpeed ();

                // limit tick mark
                const float l = vehicle->annoteMaxRelSpeed;
                draw2dLine (Vec3 (m+(f*l), v-3, 0), Vec3 (m+(f*l),v+3, 0), gBlack, drawGetWindowWidth(), drawGetWindowHeight());
                // two "inverse speedometers" showing limits due to curvature and
                // path alignment
                if (l!=0)
                {
                    const float c = vehicle->annoteMaxRelSpeedCurve;
                    const float p = vehicle->annoteMaxRelSpeedPath;
                    draw2dLine (Vec3(m+(f*c), v+1, 0), Vec3(w-m, v+1, 0), gRed, drawGetWindowWidth(), drawGetWindowHeight());
                    draw2dLine (Vec3(m+(f*p), v-2, 0), Vec3(w-m, v-1, 0), gGreen, drawGetWindowWidth(), drawGetWindowHeight());
                }
                // speedometer: horizontal line with length proportional to speed
                draw2dLine (Vec3 (m, v, 0), Vec3 (m + (f * s), v, 0), gWhite, drawGetWindowWidth(), drawGetWindowHeight());
                // min and max tick marks
                draw2dLine (Vec3 (m,       v, 0), Vec3 (m,      v-2, 0), gWhite, drawGetWindowWidth(), drawGetWindowHeight());
                draw2dLine (Vec3 (w-m,     v, 0), Vec3 (w-m,    v-2, 0), gWhite, drawGetWindowWidth(), drawGetWindowHeight());
            }
        }